

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O0

void Ga2_ManAbsPrintFrame(Ga2_Man_t *p,int nFrames,int nConfls,int nCexes,abctime Time,int fFinal)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  double dVar6;
  double dVar7;
  bool local_31;
  int fUseNewLine;
  int fFinal_local;
  abctime Time_local;
  int nCexes_local;
  int nConfls_local;
  int nFrames_local;
  Ga2_Man_t *p_local;
  
  if ((fFinal == 0) || (local_31 = true, nCexes == 0)) {
    local_31 = p->pPars->fVeryVerbose != 0;
  }
  uVar1 = (uint)local_31;
  iVar2 = Abc_FrameIsBatchMode();
  if ((iVar2 == 0) || (uVar1 != 0)) {
    p->fUseNewLine = uVar1;
    Abc_Print(1,"%4d :",(ulong)(uint)nFrames);
    iVar2 = Vec_IntSize(p->vAbs);
    uVar3 = Abc_MinInt(100,(iVar2 * 100) / p->nMarked);
    Abc_Print(1,"%4d",(ulong)uVar3);
    uVar3 = Vec_IntSize(p->vAbs);
    Abc_Print(1,"%6d",(ulong)uVar3);
    iVar2 = Vec_IntSize(p->vValues);
    iVar4 = Vec_IntSize(p->vAbs);
    Abc_Print(1,"%5d",(ulong)((iVar2 - iVar4) - 1));
    uVar3 = Ga2_GlaAbsCount(p,1,0);
    Abc_Print(1,"%5d",(ulong)uVar3);
    uVar3 = Ga2_GlaAbsCount(p,0,1);
    Abc_Print(1,"%6d",(ulong)uVar3);
    Abc_Print(1,"%8d",(ulong)(uint)nConfls);
    if (nCexes == 0) {
      Abc_Print(1,"%5c",0x2d);
    }
    else {
      Abc_Print(1,"%5d",(ulong)(uint)nCexes);
    }
    iVar2 = sat_solver2_nvars(p->pSat);
    Abc_PrintInt(iVar2);
    iVar2 = sat_solver2_nclauses(p->pSat);
    Abc_PrintInt(iVar2);
    iVar2 = sat_solver2_nlearnts(p->pSat);
    Abc_PrintInt(iVar2);
    Abc_Print(1,"%9.2f sec",((double)Time * 1.0) / 1000000.0);
    dVar6 = sat_solver2_memory_proof(p->pSat);
    dVar7 = sat_solver2_memory(p->pSat,0);
    Abc_Print(1,"%5.0f MB",(dVar6 + dVar7) / 1048576.0);
    pcVar5 = "\r";
    if (uVar1 != 0) {
      pcVar5 = "\n";
    }
    Abc_Print(1,"%s",pcVar5);
    fflush(_stdout);
  }
  return;
}

Assistant:

void Ga2_ManAbsPrintFrame( Ga2_Man_t * p, int nFrames, int nConfls, int nCexes, abctime Time, int fFinal )
{
    int fUseNewLine = ((fFinal && nCexes) || p->pPars->fVeryVerbose);
    if ( Abc_FrameIsBatchMode() && !fUseNewLine )
        return;
    p->fUseNewLine = fUseNewLine;
    Abc_Print( 1, "%4d :", nFrames );
    Abc_Print( 1, "%4d", Abc_MinInt(100, 100 * Vec_IntSize(p->vAbs) / p->nMarked) ); 
    Abc_Print( 1, "%6d", Vec_IntSize(p->vAbs) );
    Abc_Print( 1, "%5d", Vec_IntSize(p->vValues)-Vec_IntSize(p->vAbs)-1 );
    Abc_Print( 1, "%5d", Ga2_GlaAbsCount(p, 1, 0) );
    Abc_Print( 1, "%6d", Ga2_GlaAbsCount(p, 0, 1) );
    Abc_Print( 1, "%8d", nConfls );
    if ( nCexes == 0 )
        Abc_Print( 1, "%5c", '-' ); 
    else
        Abc_Print( 1, "%5d", nCexes ); 
    Abc_PrintInt( sat_solver2_nvars(p->pSat) );
    Abc_PrintInt( sat_solver2_nclauses(p->pSat) );
    Abc_PrintInt( sat_solver2_nlearnts(p->pSat) );
    Abc_Print( 1, "%9.2f sec", 1.0*Time/CLOCKS_PER_SEC );
    Abc_Print( 1, "%5.0f MB", (sat_solver2_memory_proof(p->pSat) + sat_solver2_memory(p->pSat, 0)) / (1<<20) );
    Abc_Print( 1, "%s", fUseNewLine ? "\n" : "\r" );
    fflush( stdout );
}